

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFExporter.cpp
# Opt level: O0

void __thiscall Assimp::glTFExporter::ExportMeshes(glTFExporter *this)

{
  uint uVar1;
  undefined4 uVar2;
  int iVar3;
  size_t sVar4;
  undefined1 auVar5 [16];
  size_t sVar6;
  bool bVar7;
  bool bVar8;
  element_type *peVar9;
  char *pcVar10;
  Skin *pSVar11;
  Logger *this_00;
  basic_formatter *this_01;
  Mesh *pMVar12;
  reference pvVar13;
  Buffer *pBVar14;
  reference pvVar15;
  size_type sVar16;
  uint8_t *puVar17;
  reference pvVar18;
  unsigned_long uVar19;
  Buffer *pBVar20;
  uchar *pReplace_Data;
  SCompression_Open3DGC *pSVar21;
  ulong uVar22;
  void *data;
  reference v_00;
  Node *pNVar23;
  Ref<glTF::Buffer> RVar24;
  Ref<glTF::Skin> RVar25;
  Ref<glTF::Mesh> RVar26;
  Ref<glTF::Material> RVar27;
  Ref<glTF::Accessor> RVar28;
  Ref<glTF::Node> RVar29;
  undefined1 auStack_17bc0 [8];
  Ref<glTF::Node> rootJoint;
  Ref<glTF::Mesh> RStack_17b80;
  string asStack_17b70 [8];
  string meshID;
  Ref<glTF::Node> meshNode;
  undefined1 auStack_17b30 [8];
  Ref<glTF::Node> rootNode;
  vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *pvStack_17b10;
  Ref<glTF::Accessor> invBindMatrixAccessor;
  uint idx_joint;
  mat4 *invBindMatrixData;
  SCompression_Open3DGC *pSStack_17ae8;
  SCompression_Open3DGC *ext;
  size_t num;
  size_t num_tc;
  O3DGCSC3DMCPredictionMode prediction_texcoord;
  O3DGCSC3DMCPredictionMode prediction_normal;
  O3DGCSC3DMCPredictionMode prediction_position;
  uint quant_texcoord;
  uint quant_normal;
  uint quant_coord;
  SC3DMCEncodeParams comp_o3dgc_params;
  IndexedFaceSet<unsigned_short> comp_o3dgc_ifs;
  SC3DMCEncoder<unsigned_short> encoder;
  BinaryStream bs;
  ulong local_4c0;
  size_t j_1;
  size_t i_1;
  undefined1 local_4a8 [4];
  uint nIndicesPerFace;
  vector<unsigned_short,_std::allocator<unsigned_short>_> indices;
  undefined1 local_480 [8];
  Ref<glTF::Accessor> tc;
  uint local_468;
  Value type;
  uint j;
  int i;
  undefined1 local_450 [8];
  Ref<glTF::Accessor> n;
  undefined1 local_430 [8];
  Ref<glTF::Accessor> v;
  Primitive *p;
  undefined1 local_3e8 [8];
  Ref<glTF::Mesh> m;
  string local_3d0;
  undefined1 local_3b0 [8];
  string meshId;
  string local_218;
  undefined1 local_1f8 [8];
  string msg;
  aiMesh *aim_1;
  uint idx_mesh_1;
  undefined1 local_1a8 [8];
  vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_> inverseBindMatricesData;
  string local_188;
  undefined1 local_168 [8];
  string skinName;
  Ref<glTF::Skin> skinRef;
  aiMesh *aim;
  uint idx_mesh;
  bool createSkin;
  undefined1 local_f8 [8];
  Ref<glTF::Buffer> b;
  string local_e0;
  undefined1 local_c0 [8];
  string bufferId;
  string bufferIdPrefix;
  allocator<char> local_69;
  string local_68 [8];
  string fname;
  bool comp_allow;
  size_t idx_srcdata_ind;
  vector<unsigned_long,_std::allocator<unsigned_long>_> idx_srcdata_tc;
  size_t idx_srcdata_normal;
  size_t idx_srcdata_begin;
  glTFExporter *this_local;
  
  idx_srcdata_normal = 0;
  idx_srcdata_tc.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0xffffffffffffffff;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&idx_srcdata_ind);
  pcVar10 = this->mFilename;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_68,pcVar10,&local_69);
  std::allocator<char>::~allocator(&local_69);
  std::__cxx11::string::rfind((char *)local_68,0xba3d3c);
  std::__cxx11::string::substr((ulong)((long)&bufferId.field_2 + 8),(ulong)local_68);
  peVar9 = std::__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->mAsset);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"",(allocator<char> *)&b.field_0xf);
  pcVar10 = (char *)std::__cxx11::string::c_str();
  glTF::Asset::FindUniqueID((string *)local_c0,peVar9,&local_e0,pcVar10);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&b.field_0xf);
  peVar9 = std::__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->mAsset);
  RVar24 = glTF::Asset::GetBodyBuffer(peVar9);
  local_f8 = (undefined1  [8])RVar24.vector;
  b.vector._0_4_ = RVar24.index;
  bVar7 = glTF::Ref::operator_cast_to_bool((Ref *)local_f8);
  if (!bVar7) {
    peVar9 = std::__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mAsset);
    RVar24 = glTF::LazyDict<glTF::Buffer>::Create(&peVar9->buffers,(string *)local_c0);
    local_f8 = (undefined1  [8])RVar24.vector;
    b.vector._0_4_ = RVar24.index;
  }
  bVar7 = false;
  aim._0_4_ = 0;
  do {
    if (this->mScene->mNumMeshes <= (uint)aim) {
LAB_004dc996:
      glTF::Ref<glTF::Skin>::Ref((Ref<glTF::Skin> *)((long)&skinName.field_2 + 8));
      peVar9 = std::__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->mAsset);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_188,"skin",
                 (allocator<char> *)
                 ((long)&inverseBindMatricesData.
                         super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      glTF::Asset::FindUniqueID((string *)local_168,peVar9,&local_188,"skin");
      std::__cxx11::string::~string((string *)&local_188);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&inverseBindMatricesData.
                         super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      std::vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>::vector
                ((vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_> *)local_1a8);
      if (bVar7) {
        peVar9 = std::__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->mAsset);
        RVar25 = glTF::LazyDict<glTF::Skin>::Create(&peVar9->skins,(string *)local_168);
        skinName.field_2._8_8_ = RVar25.vector;
        skinRef.vector._0_4_ = RVar25.index;
        pSVar11 = glTF::Ref<glTF::Skin>::operator->
                            ((Ref<glTF::Skin> *)((long)&skinName.field_2 + 8));
        std::__cxx11::string::operator=((string *)&pSVar11->name,(string *)local_168);
      }
      for (aim_1._4_4_ = 0; aim_1._4_4_ < this->mScene->mNumMeshes; aim_1._4_4_ = aim_1._4_4_ + 1) {
        msg.field_2._8_8_ = this->mScene->mMeshes[aim_1._4_4_];
        fname.field_2._M_local_buf[0xf] =
             ExportProperties::GetPropertyBool(this->mProperties,"extensions.Open3DGC.use",false);
        if (((((bool)fname.field_2._M_local_buf[0xf]) && (*(int *)msg.field_2._8_8_ == 4)) &&
            (*(int *)(msg.field_2._8_8_ + 4) != 0)) && (*(int *)(msg.field_2._8_8_ + 8) != 0)) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&idx_srcdata_ind);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&idx_srcdata_ind,8);
        }
        else {
          std::__cxx11::string::string((string *)local_1f8);
          if (*(int *)msg.field_2._8_8_ == 4) {
            std::__cxx11::string::operator=((string *)local_1f8,"mesh must has vertices and faces.")
            ;
          }
          else {
            std::__cxx11::string::operator=
                      ((string *)local_1f8,"all primitives of the mesh must be a triangles.");
          }
          this_00 = DefaultLogger::get();
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          basic_formatter<char[41]>
                    ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&meshId.field_2 + 8),
                     (char (*) [41])"GLTF: can not use Open3DGC-compression: ");
          this_01 = (basic_formatter *)
                    Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                    operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                              (meshId.field_2._M_local_buf + 8),
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_1f8);
          Formatter::basic_formatter::operator_cast_to_string(&local_218,this_01);
          Logger::warn(this_00,&local_218);
          std::__cxx11::string::~string((string *)&local_218);
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          ~basic_formatter((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&meshId.field_2 + 8));
          fname.field_2._M_local_buf[0xf] = '\0';
          std::__cxx11::string::~string((string *)local_1f8);
        }
        peVar9 = std::__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->mAsset);
        pcVar10 = aiString::C_Str((aiString *)(msg.field_2._8_8_ + 0xec));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3d0,pcVar10,(allocator<char> *)&m.field_0xf);
        glTF::Asset::FindUniqueID((string *)local_3b0,peVar9,&local_3d0,"mesh");
        std::__cxx11::string::~string((string *)&local_3d0);
        std::allocator<char>::~allocator((allocator<char> *)&m.field_0xf);
        peVar9 = std::__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->mAsset);
        RVar26 = glTF::LazyDict<glTF::Mesh>::Create(&peVar9->meshes,(string *)local_3b0);
        local_3e8 = (undefined1  [8])RVar26.vector;
        m.vector._0_4_ = RVar26.index;
        pMVar12 = glTF::Ref<glTF::Mesh>::operator->((Ref<glTF::Mesh> *)local_3e8);
        std::vector<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>::resize
                  (&pMVar12->primitives,1);
        pMVar12 = glTF::Ref<glTF::Mesh>::operator->((Ref<glTF::Mesh> *)local_3e8);
        pvVar13 = std::vector<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>::back
                            (&pMVar12->primitives);
        peVar9 = std::__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->mAsset);
        RVar27 = glTF::LazyDict<glTF::Material>::Get
                           (&peVar9->materials,*(uint *)(msg.field_2._8_8_ + 0xe8));
        v._8_8_ = RVar27.vector;
        (pvVar13->material).vector =
             (vector<glTF::Material_*,_std::allocator<glTF::Material_*>_> *)v._8_8_;
        (pvVar13->material).index = RVar27.index;
        if ((fname.field_2._M_local_buf[0xf] & 1U) != 0) {
          pBVar14 = glTF::Ref<glTF::Buffer>::operator->((Ref<glTF::Buffer> *)local_f8);
          idx_srcdata_normal = pBVar14->byteLength;
        }
        peVar9 = std::__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator*((__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->mAsset);
        RVar28 = ExportData(peVar9,(string *)local_3b0,(Ref<glTF::Buffer> *)local_f8,
                            *(uint *)(msg.field_2._8_8_ + 4),*(void **)(msg.field_2._8_8_ + 0x10),
                            VEC3,VEC3,ComponentType_FLOAT,false);
        n._8_8_ = RVar28.vector;
        v.vector._0_4_ = RVar28.index;
        local_430 = (undefined1  [8])n._8_8_;
        bVar8 = glTF::Ref::operator_cast_to_bool((Ref *)local_430);
        if (bVar8) {
          std::vector<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>::
          push_back(&(pvVar13->attributes).position,(value_type *)local_430);
        }
        if (((fname.field_2._M_local_buf[0xf] & 1U) != 0) &&
           (*(long *)(msg.field_2._8_8_ + 0x18) != 0)) {
          pBVar14 = glTF::Ref<glTF::Buffer>::operator->((Ref<glTF::Buffer> *)local_f8);
          idx_srcdata_tc.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)pBVar14->byteLength;
        }
        peVar9 = std::__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator*((__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->mAsset);
        RVar28 = ExportData(peVar9,(string *)local_3b0,(Ref<glTF::Buffer> *)local_f8,
                            *(uint *)(msg.field_2._8_8_ + 4),*(void **)(msg.field_2._8_8_ + 0x18),
                            VEC3,VEC3,ComponentType_FLOAT,false);
        local_450 = (undefined1  [8])RVar28.vector;
        n.vector._0_4_ = RVar28.index;
        bVar8 = glTF::Ref::operator_cast_to_bool((Ref *)local_450);
        if (bVar8) {
          std::vector<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>::
          push_back(&(pvVar13->attributes).normal,(value_type *)local_450);
        }
        for (type = SCALAR; (int)type < 8; type = type + VEC2) {
          if (1 < *(uint *)(msg.field_2._8_8_ + 0xb0 + (long)(int)type * 4)) {
            for (local_468 = 0; local_468 < *(uint *)(msg.field_2._8_8_ + 4);
                local_468 = local_468 + 1) {
              *(float *)(*(long *)(msg.field_2._8_8_ + 0x70 + (long)(int)type * 8) +
                         (ulong)local_468 * 0xc + 4) =
                   1.0 - *(float *)(*(long *)(msg.field_2._8_8_ + 0x70 + (long)(int)type * 8) +
                                    (ulong)local_468 * 0xc + 4);
            }
          }
          if (*(int *)(msg.field_2._8_8_ + 0xb0 + (long)(int)type * 4) != 0) {
            tc._12_4_ = 2;
            if (*(int *)(msg.field_2._8_8_ + 0xb0 + (long)(int)type * 4) == 2) {
              tc._12_4_ = 1;
            }
            if ((fname.field_2._M_local_buf[0xf] & 1U) != 0) {
              pBVar14 = glTF::Ref<glTF::Buffer>::operator->((Ref<glTF::Buffer> *)local_f8);
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&idx_srcdata_ind,
                         &pBVar14->byteLength);
            }
            peVar9 = std::__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator*((__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&this->mAsset);
            RVar28 = ExportData(peVar9,(string *)local_3b0,(Ref<glTF::Buffer> *)local_f8,
                                *(uint *)(msg.field_2._8_8_ + 4),
                                *(void **)(msg.field_2._8_8_ + 0x70 + (long)(int)type * 8),VEC3,
                                tc._12_4_,ComponentType_FLOAT,false);
            indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)RVar28.vector;
            tc.vector._0_4_ = RVar28.index;
            local_480 = (undefined1  [8])
                        indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage;
            bVar8 = glTF::Ref::operator_cast_to_bool((Ref *)local_480);
            if (bVar8) {
              std::vector<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>::
              push_back(&(pvVar13->attributes).texcoord,(value_type *)local_480);
            }
          }
        }
        pBVar14 = glTF::Ref<glTF::Buffer>::operator->((Ref<glTF::Buffer> *)local_f8);
        sVar4 = pBVar14->byteLength;
        if (*(int *)(msg.field_2._8_8_ + 8) != 0) {
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                    ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_4a8);
          uVar1 = **(uint **)(msg.field_2._8_8_ + 0xd0);
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
                    ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_4a8,
                     (ulong)(*(int *)(msg.field_2._8_8_ + 8) * uVar1));
          for (j_1 = 0; j_1 < *(uint *)(msg.field_2._8_8_ + 8); j_1 = j_1 + 1) {
            for (local_4c0 = 0; local_4c0 < uVar1; local_4c0 = local_4c0 + 1) {
              uVar2 = *(undefined4 *)
                       (*(long *)(*(long *)(msg.field_2._8_8_ + 0xd0) + j_1 * 0x10 + 8) +
                       local_4c0 * 4);
              pvVar15 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                                  ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                                   local_4a8,j_1 * uVar1 + local_4c0);
              *pvVar15 = (value_type)uVar2;
            }
          }
          peVar9 = std::__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator*((__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&this->mAsset);
          sVar16 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                             ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_4a8);
          pvVar15 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_4a8,
                               0);
          RVar28 = ExportData(peVar9,(string *)local_3b0,(Ref<glTF::Buffer> *)local_f8,(uint)sVar16,
                              pvVar15,SCALAR,SCALAR,ComponentType_UNSIGNED_SHORT,true);
          (pvVar13->indices).vector = RVar28.vector;
          (pvVar13->indices).index = RVar28.index;
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
                    ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_4a8);
        }
        iVar3 = *(int *)msg.field_2._8_8_;
        if (iVar3 == 1) {
          pvVar13->mode = PrimitiveMode_POINTS;
        }
        else if (iVar3 == 2) {
          pvVar13->mode = PrimitiveMode_LINES;
        }
        else if (iVar3 == 8) {
          pvVar13->mode = PrimitiveMode_TRIANGLES;
        }
        else {
          pvVar13->mode = PrimitiveMode_TRIANGLES;
        }
        bVar8 = aiMesh::HasBones((aiMesh *)msg.field_2._8_8_);
        if (bVar8) {
          peVar9 = std::__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator*((__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&this->mAsset);
          ExportSkin(peVar9,(aiMesh *)msg.field_2._8_8_,(Ref<glTF::Mesh> *)local_3e8,
                     (Ref<glTF::Buffer> *)local_f8,(Ref<glTF::Skin> *)((long)&skinName.field_2 + 8),
                     (vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_> *)local_1a8
                    );
        }
        if ((fname.field_2._M_local_buf[0xf] & 1U) != 0) {
          o3dgc::BinaryStream::BinaryStream((BinaryStream *)&encoder.m_streamType,0x1000);
          o3dgc::SC3DMCEncoder<unsigned_short>::SC3DMCEncoder
                    ((SC3DMCEncoder<unsigned_short> *)&comp_o3dgc_ifs.m_creaseAngle);
          o3dgc::IndexedFaceSet<unsigned_short>::IndexedFaceSet
                    ((IndexedFaceSet<unsigned_short> *)&comp_o3dgc_params.m_streamTypeMode);
          o3dgc::SC3DMCEncodeParams::SC3DMCEncodeParams((SC3DMCEncodeParams *)&quant_normal);
          quant_texcoord =
               ExportProperties::GetPropertyInteger
                         (this->mProperties,"extensions.Open3DGC.quantization.POSITION",0xc);
          prediction_position =
               ExportProperties::GetPropertyInteger
                         (this->mProperties,"extensions.Open3DGC.quantization.NORMAL",10);
          prediction_normal =
               ExportProperties::GetPropertyInteger
                         (this->mProperties,"extensions.Open3DGC.quantization.TEXCOORD",10);
          prediction_texcoord = O3DGC_SC3DMC_PARALLELOGRAM_PREDICTION;
          num_tc._4_4_ = O3DGC_SC3DMC_SURF_NORMALS_PREDICTION;
          num_tc._0_4_ = O3DGC_SC3DMC_PARALLELOGRAM_PREDICTION;
          o3dgc::IndexedFaceSet<unsigned_short>::SetCCW
                    ((IndexedFaceSet<unsigned_short> *)&comp_o3dgc_params.m_streamTypeMode,true);
          o3dgc::IndexedFaceSet<unsigned_short>::SetIsTriangularMesh
                    ((IndexedFaceSet<unsigned_short> *)&comp_o3dgc_params.m_streamTypeMode,true);
          o3dgc::IndexedFaceSet<unsigned_short>::SetNumFloatAttributes
                    ((IndexedFaceSet<unsigned_short> *)&comp_o3dgc_params.m_streamTypeMode,0);
          o3dgc::SC3DMCEncodeParams::SetCoordQuantBits
                    ((SC3DMCEncodeParams *)&quant_normal,quant_texcoord);
          o3dgc::SC3DMCEncodeParams::SetCoordPredMode
                    ((SC3DMCEncodeParams *)&quant_normal,prediction_texcoord);
          o3dgc::IndexedFaceSet<unsigned_short>::SetNCoord
                    ((IndexedFaceSet<unsigned_short> *)&comp_o3dgc_params.m_streamTypeMode,
                     (ulong)*(uint *)(msg.field_2._8_8_ + 4));
          pBVar14 = glTF::Ref<glTF::Buffer>::operator->((Ref<glTF::Buffer> *)local_f8);
          puVar17 = glTF::Buffer::GetPointer(pBVar14);
          o3dgc::IndexedFaceSet<unsigned_short>::SetCoord
                    ((IndexedFaceSet<unsigned_short> *)&comp_o3dgc_params.m_streamTypeMode,
                     (Real *)(puVar17 + idx_srcdata_normal));
          if (idx_srcdata_tc.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0xffffffffffffffff) {
            o3dgc::SC3DMCEncodeParams::SetNormalQuantBits
                      ((SC3DMCEncodeParams *)&quant_normal,prediction_position);
            o3dgc::SC3DMCEncodeParams::SetNormalPredMode
                      ((SC3DMCEncodeParams *)&quant_normal,num_tc._4_4_);
            o3dgc::IndexedFaceSet<unsigned_short>::SetNNormal
                      ((IndexedFaceSet<unsigned_short> *)&comp_o3dgc_params.m_streamTypeMode,
                       (ulong)*(uint *)(msg.field_2._8_8_ + 4));
            pBVar14 = glTF::Ref<glTF::Buffer>::operator->((Ref<glTF::Buffer> *)local_f8);
            puVar17 = glTF::Buffer::GetPointer(pBVar14);
            o3dgc::IndexedFaceSet<unsigned_short>::SetNormal
                      ((IndexedFaceSet<unsigned_short> *)&comp_o3dgc_params.m_streamTypeMode,
                       (Real *)(puVar17 +
                               (long)idx_srcdata_tc.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage));
          }
          for (num = 0; sVar6 = num,
              sVar16 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                  &idx_srcdata_ind), sVar6 < sVar16; num = num + 1) {
            ext = (SCompression_Open3DGC *)
                  o3dgc::IndexedFaceSet<unsigned_short>::GetNumFloatAttributes
                            ((IndexedFaceSet<unsigned_short> *)&comp_o3dgc_params.m_streamTypeMode);
            o3dgc::SC3DMCEncodeParams::SetFloatAttributeQuantBits
                      ((SC3DMCEncodeParams *)&quant_normal,(unsigned_long)ext,
                       (ulong)prediction_normal);
            o3dgc::SC3DMCEncodeParams::SetFloatAttributePredMode
                      ((SC3DMCEncodeParams *)&quant_normal,(unsigned_long)ext,
                       (O3DGCSC3DMCPredictionMode)num_tc);
            o3dgc::IndexedFaceSet<unsigned_short>::SetNFloatAttribute
                      ((IndexedFaceSet<unsigned_short> *)&comp_o3dgc_params.m_streamTypeMode,
                       (unsigned_long)ext,(ulong)*(uint *)(msg.field_2._8_8_ + 4));
            o3dgc::IndexedFaceSet<unsigned_short>::SetFloatAttributeDim
                      ((IndexedFaceSet<unsigned_short> *)&comp_o3dgc_params.m_streamTypeMode,
                       (unsigned_long)ext,(ulong)*(uint *)(msg.field_2._8_8_ + 0xb0 + num * 4));
            o3dgc::IndexedFaceSet<unsigned_short>::SetFloatAttributeType
                      ((IndexedFaceSet<unsigned_short> *)&comp_o3dgc_params.m_streamTypeMode,
                       (unsigned_long)ext,O3DGC_IFS_FLOAT_ATTRIBUTE_TYPE_TEXCOORD);
            pSVar21 = ext;
            pBVar14 = glTF::Ref<glTF::Buffer>::operator->((Ref<glTF::Buffer> *)local_f8);
            puVar17 = glTF::Buffer::GetPointer(pBVar14);
            pvVar18 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 &idx_srcdata_ind,num);
            o3dgc::IndexedFaceSet<unsigned_short>::SetFloatAttribute
                      ((IndexedFaceSet<unsigned_short> *)&comp_o3dgc_params.m_streamTypeMode,
                       (unsigned_long)pSVar21,(Real *)(puVar17 + *pvVar18));
            o3dgc::IndexedFaceSet<unsigned_short>::SetNumFloatAttributes
                      ((IndexedFaceSet<unsigned_short> *)&comp_o3dgc_params.m_streamTypeMode,
                       (unsigned_long)((long)&(ext->super_SExtension)._vptr_SExtension + 1));
          }
          o3dgc::IndexedFaceSet<unsigned_short>::SetNCoordIndex
                    ((IndexedFaceSet<unsigned_short> *)&comp_o3dgc_params.m_streamTypeMode,
                     (ulong)*(uint *)(msg.field_2._8_8_ + 8));
          pBVar14 = glTF::Ref<glTF::Buffer>::operator->((Ref<glTF::Buffer> *)local_f8);
          puVar17 = glTF::Buffer::GetPointer(pBVar14);
          o3dgc::IndexedFaceSet<unsigned_short>::SetCoordIndex
                    ((IndexedFaceSet<unsigned_short> *)&comp_o3dgc_params.m_streamTypeMode,
                     (unsigned_short *)(puVar17 + sVar4));
          uVar19 = o3dgc::IndexedFaceSet<unsigned_short>::GetNumFloatAttributes
                             ((IndexedFaceSet<unsigned_short> *)&comp_o3dgc_params.m_streamTypeMode)
          ;
          o3dgc::SC3DMCEncodeParams::SetNumFloatAttributes
                    ((SC3DMCEncodeParams *)&quant_normal,uVar19);
          bVar8 = ExportProperties::GetPropertyBool
                            (this->mProperties,"extensions.Open3DGC.binary",true);
          if (bVar8) {
            o3dgc::SC3DMCEncodeParams::SetStreamType
                      ((SC3DMCEncodeParams *)&quant_normal,O3DGC_STREAM_TYPE_BINARY);
          }
          else {
            o3dgc::SC3DMCEncodeParams::SetStreamType
                      ((SC3DMCEncodeParams *)&quant_normal,O3DGC_STREAM_TYPE_ASCII);
          }
          o3dgc::IndexedFaceSet<unsigned_short>::ComputeMinMax
                    ((IndexedFaceSet<unsigned_short> *)&comp_o3dgc_params.m_streamTypeMode,
                     O3DGC_SC3DMC_MAX_ALL_DIMS);
          o3dgc::SC3DMCEncoder<unsigned_short>::Encode
                    ((SC3DMCEncoder<unsigned_short> *)&comp_o3dgc_ifs.m_creaseAngle,
                     (SC3DMCEncodeParams *)&quant_normal,
                     (IndexedFaceSet<unsigned_short> *)&comp_o3dgc_params.m_streamTypeMode,
                     (BinaryStream *)&encoder.m_streamType);
          pBVar14 = glTF::Ref<glTF::Buffer>::operator->((Ref<glTF::Buffer> *)local_f8);
          pBVar20 = glTF::Ref<glTF::Buffer>::operator->((Ref<glTF::Buffer> *)local_f8);
          sVar4 = pBVar20->byteLength;
          pReplace_Data = o3dgc::BinaryStream::GetBuffer((BinaryStream *)&encoder.m_streamType);
          uVar19 = o3dgc::BinaryStream::GetSize((BinaryStream *)&encoder.m_streamType);
          glTF::Buffer::ReplaceData
                    (pBVar14,idx_srcdata_normal,sVar4 - idx_srcdata_normal,pReplace_Data,uVar19);
          pSVar21 = (SCompression_Open3DGC *)operator_new(0x58);
          glTF::Mesh::SCompression_Open3DGC::SCompression_Open3DGC(pSVar21);
          pSStack_17ae8 = pSVar21;
          pBVar14 = glTF::Ref<glTF::Buffer>::operator->((Ref<glTF::Buffer> *)local_f8);
          std::__cxx11::string::operator=
                    ((string *)&pSStack_17ae8->Buffer,(string *)&(pBVar14->super_Object).id);
          pSStack_17ae8->Offset = idx_srcdata_normal;
          pBVar14 = glTF::Ref<glTF::Buffer>::operator->((Ref<glTF::Buffer> *)local_f8);
          pSStack_17ae8->Count = pBVar14->byteLength - idx_srcdata_normal;
          bVar8 = ExportProperties::GetPropertyBool
                            (this->mProperties,"extensions.Open3DGC.binary",false);
          pSStack_17ae8->Binary = bVar8;
          uVar19 = o3dgc::IndexedFaceSet<unsigned_short>::GetNCoordIndex
                             ((IndexedFaceSet<unsigned_short> *)&comp_o3dgc_params.m_streamTypeMode)
          ;
          pSStack_17ae8->IndicesCount = uVar19 * 3;
          uVar19 = o3dgc::IndexedFaceSet<unsigned_short>::GetNCoord
                             ((IndexedFaceSet<unsigned_short> *)&comp_o3dgc_params.m_streamTypeMode)
          ;
          pSStack_17ae8->VerticesCount = uVar19;
          pMVar12 = glTF::Ref<glTF::Mesh>::operator->((Ref<glTF::Mesh> *)local_3e8);
          invBindMatrixData = (mat4 *)pSStack_17ae8;
          std::__cxx11::list<glTF::Mesh::SExtension_*,_std::allocator<glTF::Mesh::SExtension_*>_>::
          push_back(&pMVar12->Extension,(value_type *)&invBindMatrixData);
          o3dgc::SC3DMCEncodeParams::~SC3DMCEncodeParams((SC3DMCEncodeParams *)&quant_normal);
          o3dgc::IndexedFaceSet<unsigned_short>::~IndexedFaceSet
                    ((IndexedFaceSet<unsigned_short> *)&comp_o3dgc_params.m_streamTypeMode);
          o3dgc::SC3DMCEncoder<unsigned_short>::~SC3DMCEncoder
                    ((SC3DMCEncoder<unsigned_short> *)&comp_o3dgc_ifs.m_creaseAngle);
          o3dgc::BinaryStream::~BinaryStream((BinaryStream *)&encoder.m_streamType);
        }
        std::__cxx11::string::~string((string *)local_3b0);
      }
      if (bVar7) {
        sVar16 = std::vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>::size
                           ((vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_> *)
                            local_1a8);
        auVar5._8_8_ = 0;
        auVar5._0_8_ = sVar16;
        uVar22 = SUB168(auVar5 * ZEXT816(0x40),0);
        if (SUB168(auVar5 * ZEXT816(0x40),8) != 0) {
          uVar22 = 0xffffffffffffffff;
        }
        data = operator_new__(uVar22);
        for (invBindMatrixAccessor._12_4_ = 0; uVar22 = (ulong)(uint)invBindMatrixAccessor._12_4_,
            sVar16 = std::vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>::size
                               ((vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>
                                 *)local_1a8), uVar22 < sVar16;
            invBindMatrixAccessor._12_4_ = invBindMatrixAccessor._12_4_ + 1) {
          v_00 = std::vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>::operator[]
                           ((vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_> *)
                            local_1a8,(ulong)(uint)invBindMatrixAccessor._12_4_);
          CopyValue(v_00,(mat4 *)((long)data + (ulong)(uint)invBindMatrixAccessor._12_4_ * 0x40));
        }
        peVar9 = std::__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator*((__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->mAsset);
        sVar16 = std::vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>::size
                           ((vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_> *)
                            local_1a8);
        RVar28 = ExportData(peVar9,(string *)local_168,(Ref<glTF::Buffer> *)local_f8,(uint)sVar16,
                            data,MAT4,MAT4,ComponentType_FLOAT,false);
        rootNode._8_8_ = RVar28.vector;
        invBindMatrixAccessor.vector._0_4_ = RVar28.index;
        pvStack_17b10 =
             (vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *)rootNode._8_8_;
        bVar7 = glTF::Ref::operator_cast_to_bool((Ref *)&pvStack_17b10);
        if (bVar7) {
          pSVar11 = glTF::Ref<glTF::Skin>::operator->
                              ((Ref<glTF::Skin> *)((long)&skinName.field_2 + 8));
          (pSVar11->inverseBindMatrices).vector = pvStack_17b10;
          (pSVar11->inverseBindMatrices).index = (uint)invBindMatrixAccessor.vector;
        }
        pSVar11 = glTF::Ref<glTF::Skin>::operator->
                            ((Ref<glTF::Skin> *)((long)&skinName.field_2 + 8));
        (pSVar11->bindShapeMatrix).isPresent = true;
        pSVar11 = glTF::Ref<glTF::Skin>::operator->
                            ((Ref<glTF::Skin> *)((long)&skinName.field_2 + 8));
        IdentityMatrix4((pSVar11->bindShapeMatrix).value);
        peVar9 = std::__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->mAsset);
        RVar29 = glTF::LazyDict<glTF::Node>::Get(&peVar9->nodes,0);
        auStack_17b30 = (undefined1  [8])RVar29.vector;
        rootNode.vector._0_4_ = RVar29.index;
        glTF::Ref<glTF::Node>::Ref((Ref<glTF::Node> *)((long)&meshID.field_2 + 8));
        peVar9 = std::__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->mAsset);
        RVar26 = glTF::LazyDict<glTF::Mesh>::Get(&peVar9->meshes,0);
        RStack_17b80.vector = RVar26.vector;
        RStack_17b80.index = RVar26.index;
        pMVar12 = glTF::Ref<glTF::Mesh>::operator->(&RStack_17b80);
        std::__cxx11::string::string(asStack_17b70,(string *)&(pMVar12->super_Object).id);
        std::__cxx11::string::string((string *)&rootJoint.index,asStack_17b70);
        FindMeshNode((Ref<glTF::Node> *)auStack_17b30,(Ref<glTF::Node> *)((long)&meshID.field_2 + 8)
                     ,(string *)&rootJoint.index);
        std::__cxx11::string::~string((string *)&rootJoint.index);
        RVar29 = FindSkeletonRootJoint((Ref<glTF::Skin> *)((long)&skinName.field_2 + 8));
        auStack_17bc0 = (undefined1  [8])RVar29.vector;
        rootJoint.vector._0_4_ = RVar29.index;
        pNVar23 = glTF::Ref<glTF::Node>::operator->((Ref<glTF::Node> *)((long)&meshID.field_2 + 8));
        std::vector<glTF::Ref<glTF::Node>,_std::allocator<glTF::Ref<glTF::Node>_>_>::push_back
                  (&pNVar23->skeletons,(value_type *)auStack_17bc0);
        pNVar23 = glTF::Ref<glTF::Node>::operator->((Ref<glTF::Node> *)((long)&meshID.field_2 + 8));
        (pNVar23->skin).vector =
             (vector<glTF::Skin_*,_std::allocator<glTF::Skin_*>_> *)skinName.field_2._8_8_;
        (pNVar23->skin).index = (uint)skinRef.vector;
        std::__cxx11::string::~string(asStack_17b70);
      }
      std::vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>::~vector
                ((vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_> *)local_1a8);
      std::__cxx11::string::~string((string *)local_168);
      std::__cxx11::string::~string((string *)local_c0);
      std::__cxx11::string::~string((string *)(bufferId.field_2._M_local_buf + 8));
      std::__cxx11::string::~string(local_68);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&idx_srcdata_ind);
      return;
    }
    bVar8 = aiMesh::HasBones(this->mScene->mMeshes[(uint)aim]);
    if (bVar8) {
      bVar7 = true;
      goto LAB_004dc996;
    }
    aim._0_4_ = (uint)aim + 1;
  } while( true );
}

Assistant:

void glTFExporter::ExportMeshes()
{
    // Not for
    //     using IndicesType = decltype(aiFace::mNumIndices);
    // But yes for
    //     using IndicesType = unsigned short;
    // because "ComponentType_UNSIGNED_SHORT" used for indices. And it's a maximal type according to glTF specification.
    typedef unsigned short IndicesType;

    // Variables needed for compression. BEGIN.
    // Indices, not pointers - because pointer to buffer is changing while writing to it.
    size_t idx_srcdata_begin = 0; // Index of buffer before writing mesh data. Also, index of begin of coordinates array in buffer.
    size_t idx_srcdata_normal = SIZE_MAX;// Index of begin of normals array in buffer. SIZE_MAX - mean that mesh has no normals.
    std::vector<size_t> idx_srcdata_tc;// Array of indices. Every index point to begin of texture coordinates array in buffer.
    size_t idx_srcdata_ind;// Index of begin of coordinates indices array in buffer.
    bool comp_allow;// Point that data of current mesh can be compressed.
    // Variables needed for compression. END.

    std::string fname = std::string(mFilename);
    std::string bufferIdPrefix = fname.substr(0, fname.rfind(".gltf"));
    std::string bufferId = mAsset->FindUniqueID("", bufferIdPrefix.c_str());

    Ref<Buffer> b = mAsset->GetBodyBuffer();
    if (!b) {
       b = mAsset->buffers.Create(bufferId);
    }

    //----------------------------------------
    // Initialize variables for the skin
    bool createSkin = false;
    for (unsigned int idx_mesh = 0; idx_mesh < mScene->mNumMeshes; ++idx_mesh) {
        const aiMesh* aim = mScene->mMeshes[idx_mesh];
        if(aim->HasBones()) {
            createSkin = true;
            break;
        }
    }

    Ref<Skin> skinRef;
    std::string skinName = mAsset->FindUniqueID("skin", "skin");
    std::vector<aiMatrix4x4> inverseBindMatricesData;
    if(createSkin) {
        skinRef = mAsset->skins.Create(skinName);
        skinRef->name = skinName;
    }
    //----------------------------------------

	for (unsigned int idx_mesh = 0; idx_mesh < mScene->mNumMeshes; ++idx_mesh) {
		const aiMesh* aim = mScene->mMeshes[idx_mesh];

		// Check if compressing requested and mesh can be encoded.
#ifdef ASSIMP_IMPORTER_GLTF_USE_OPEN3DGC
		comp_allow = mProperties->GetPropertyBool("extensions.Open3DGC.use", false);
#else
		comp_allow = false;
#endif

		if(comp_allow && (aim->mPrimitiveTypes == aiPrimitiveType_TRIANGLE) && (aim->mNumVertices > 0) && (aim->mNumFaces > 0))
		{
			idx_srcdata_tc.clear();
			idx_srcdata_tc.reserve(AI_MAX_NUMBER_OF_TEXTURECOORDS);
		}
		else
		{
			std::string msg;

			if(aim->mPrimitiveTypes != aiPrimitiveType_TRIANGLE)
				msg = "all primitives of the mesh must be a triangles.";
			else
				msg = "mesh must has vertices and faces.";

            ASSIMP_LOG_WARN_F("GLTF: can not use Open3DGC-compression: ", msg);
            comp_allow = false;
		}

        std::string meshId = mAsset->FindUniqueID(aim->mName.C_Str(), "mesh");
        Ref<Mesh> m = mAsset->meshes.Create(meshId);
        m->primitives.resize(1);
        Mesh::Primitive& p = m->primitives.back();

        p.material = mAsset->materials.Get(aim->mMaterialIndex);

		/******************* Vertices ********************/
		// If compression is used then you need parameters of uncompressed region: begin and size. At this step "begin" is stored.
		if(comp_allow) idx_srcdata_begin = b->byteLength;

        Ref<Accessor> v = ExportData(*mAsset, meshId, b, aim->mNumVertices, aim->mVertices, AttribType::VEC3, AttribType::VEC3, ComponentType_FLOAT);
		if (v) p.attributes.position.push_back(v);

		/******************** Normals ********************/
		if(comp_allow && (aim->mNormals != 0)) idx_srcdata_normal = b->byteLength;// Store index of normals array.

		Ref<Accessor> n = ExportData(*mAsset, meshId, b, aim->mNumVertices, aim->mNormals, AttribType::VEC3, AttribType::VEC3, ComponentType_FLOAT);
		if (n) p.attributes.normal.push_back(n);

		/************** Texture coordinates **************/
        for (int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++i) {
            // Flip UV y coords
            if (aim -> mNumUVComponents[i] > 1) {
                for (unsigned int j = 0; j < aim->mNumVertices; ++j) {
                    aim->mTextureCoords[i][j].y = 1 - aim->mTextureCoords[i][j].y;
                }
            }

            if (aim->mNumUVComponents[i] > 0) {
                AttribType::Value type = (aim->mNumUVComponents[i] == 2) ? AttribType::VEC2 : AttribType::VEC3;

				if(comp_allow) idx_srcdata_tc.push_back(b->byteLength);// Store index of texture coordinates array.

				Ref<Accessor> tc = ExportData(*mAsset, meshId, b, aim->mNumVertices, aim->mTextureCoords[i], AttribType::VEC3, type, ComponentType_FLOAT, false);
				if (tc) p.attributes.texcoord.push_back(tc);
			}
		}

		/*************** Vertices indices ****************/
		idx_srcdata_ind = b->byteLength;// Store index of indices array.

		if (aim->mNumFaces > 0) {
			std::vector<IndicesType> indices;
			unsigned int nIndicesPerFace = aim->mFaces[0].mNumIndices;
            indices.resize(aim->mNumFaces * nIndicesPerFace);
            for (size_t i = 0; i < aim->mNumFaces; ++i) {
                for (size_t j = 0; j < nIndicesPerFace; ++j) {
                    indices[i*nIndicesPerFace + j] = uint16_t(aim->mFaces[i].mIndices[j]);
                }
            }

			p.indices = ExportData(*mAsset, meshId, b, unsigned(indices.size()), &indices[0], AttribType::SCALAR, AttribType::SCALAR, ComponentType_UNSIGNED_SHORT, true);
		}

        switch (aim->mPrimitiveTypes) {
            case aiPrimitiveType_POLYGON:
                p.mode = PrimitiveMode_TRIANGLES; break; // TODO implement this
            case aiPrimitiveType_LINE:
                p.mode = PrimitiveMode_LINES; break;
            case aiPrimitiveType_POINT:
                p.mode = PrimitiveMode_POINTS; break;
            default: // aiPrimitiveType_TRIANGLE
                p.mode = PrimitiveMode_TRIANGLES;
        }

    /*************** Skins ****************/
    if(aim->HasBones()) {
        ExportSkin(*mAsset, aim, m, b, skinRef, inverseBindMatricesData);
    }

		/****************** Compression ******************/
		///TODO: animation: weights, joints.
		if(comp_allow)
		{
#ifdef ASSIMP_IMPORTER_GLTF_USE_OPEN3DGC
			// Only one type of compression supported at now - Open3DGC.
			//
			o3dgc::BinaryStream bs;
			o3dgc::SC3DMCEncoder<IndicesType> encoder;
			o3dgc::IndexedFaceSet<IndicesType> comp_o3dgc_ifs;
			o3dgc::SC3DMCEncodeParams comp_o3dgc_params;

			//
			// Fill data for encoder.
			//
			// Quantization
			unsigned quant_coord = mProperties->GetPropertyInteger("extensions.Open3DGC.quantization.POSITION", 12);
			unsigned quant_normal = mProperties->GetPropertyInteger("extensions.Open3DGC.quantization.NORMAL", 10);
			unsigned quant_texcoord = mProperties->GetPropertyInteger("extensions.Open3DGC.quantization.TEXCOORD", 10);

			// Prediction
			o3dgc::O3DGCSC3DMCPredictionMode prediction_position = o3dgc::O3DGC_SC3DMC_PARALLELOGRAM_PREDICTION;
			o3dgc::O3DGCSC3DMCPredictionMode prediction_normal =  o3dgc::O3DGC_SC3DMC_SURF_NORMALS_PREDICTION;
			o3dgc::O3DGCSC3DMCPredictionMode prediction_texcoord = o3dgc::O3DGC_SC3DMC_PARALLELOGRAM_PREDICTION;

			// IndexedFacesSet: "Crease angle", "solid", "convex" are set to default.
			comp_o3dgc_ifs.SetCCW(true);
			comp_o3dgc_ifs.SetIsTriangularMesh(true);
			comp_o3dgc_ifs.SetNumFloatAttributes(0);
			// Coordinates
			comp_o3dgc_params.SetCoordQuantBits(quant_coord);
			comp_o3dgc_params.SetCoordPredMode(prediction_position);
			comp_o3dgc_ifs.SetNCoord(aim->mNumVertices);
			comp_o3dgc_ifs.SetCoord((o3dgc::Real* const)&b->GetPointer()[idx_srcdata_begin]);
			// Normals
			if(idx_srcdata_normal != SIZE_MAX)
			{
				comp_o3dgc_params.SetNormalQuantBits(quant_normal);
				comp_o3dgc_params.SetNormalPredMode(prediction_normal);
				comp_o3dgc_ifs.SetNNormal(aim->mNumVertices);
				comp_o3dgc_ifs.SetNormal((o3dgc::Real* const)&b->GetPointer()[idx_srcdata_normal]);
			}

			// Texture coordinates
			for(size_t num_tc = 0; num_tc < idx_srcdata_tc.size(); num_tc++)
			{
				size_t num = comp_o3dgc_ifs.GetNumFloatAttributes();

				comp_o3dgc_params.SetFloatAttributeQuantBits(static_cast<unsigned long>(num), quant_texcoord);
				comp_o3dgc_params.SetFloatAttributePredMode(static_cast<unsigned long>(num), prediction_texcoord);
				comp_o3dgc_ifs.SetNFloatAttribute(static_cast<unsigned long>(num), aim->mNumVertices);// number of elements.
				comp_o3dgc_ifs.SetFloatAttributeDim(static_cast<unsigned long>(num), aim->mNumUVComponents[num_tc]);// components per element: aiVector3D => x * float
				comp_o3dgc_ifs.SetFloatAttributeType(static_cast<unsigned long>(num), o3dgc::O3DGC_IFS_FLOAT_ATTRIBUTE_TYPE_TEXCOORD);
				comp_o3dgc_ifs.SetFloatAttribute(static_cast<unsigned long>(num), (o3dgc::Real* const)&b->GetPointer()[idx_srcdata_tc[num_tc]]);
				comp_o3dgc_ifs.SetNumFloatAttributes(static_cast<unsigned long>(num + 1));
			}

			// Coordinates indices
			comp_o3dgc_ifs.SetNCoordIndex(aim->mNumFaces);
			comp_o3dgc_ifs.SetCoordIndex((IndicesType* const)&b->GetPointer()[idx_srcdata_ind]);
			// Prepare to encoding
			comp_o3dgc_params.SetNumFloatAttributes(comp_o3dgc_ifs.GetNumFloatAttributes());
			if(mProperties->GetPropertyBool("extensions.Open3DGC.binary", true))
				comp_o3dgc_params.SetStreamType(o3dgc::O3DGC_STREAM_TYPE_BINARY);
			else
				comp_o3dgc_params.SetStreamType(o3dgc::O3DGC_STREAM_TYPE_ASCII);

			comp_o3dgc_ifs.ComputeMinMax(o3dgc::O3DGC_SC3DMC_MAX_ALL_DIMS);
			//
			// Encoding
			//
			encoder.Encode(comp_o3dgc_params, comp_o3dgc_ifs, bs);
			// Replace data in buffer.
			b->ReplaceData(idx_srcdata_begin, b->byteLength - idx_srcdata_begin, bs.GetBuffer(), bs.GetSize());
			//
			// Add information about extension to mesh.
			//
			// Create extension structure.
			Mesh::SCompression_Open3DGC* ext = new Mesh::SCompression_Open3DGC;

			// Fill it.
			ext->Buffer = b->id;
			ext->Offset = idx_srcdata_begin;
			ext->Count = b->byteLength - idx_srcdata_begin;
			ext->Binary = mProperties->GetPropertyBool("extensions.Open3DGC.binary");
			ext->IndicesCount = comp_o3dgc_ifs.GetNCoordIndex() * 3;
			ext->VerticesCount = comp_o3dgc_ifs.GetNCoord();
			// And assign to mesh.
			m->Extension.push_back(ext);
#endif
		}// if(comp_allow)
	}// for (unsigned int i = 0; i < mScene->mNumMeshes; ++i)

    //----------------------------------------
    // Finish the skin
    // Create the Accessor for skinRef->inverseBindMatrices
    if (createSkin) {
        mat4* invBindMatrixData = new mat4[inverseBindMatricesData.size()];
        for ( unsigned int idx_joint = 0; idx_joint < inverseBindMatricesData.size(); ++idx_joint) {
            CopyValue(inverseBindMatricesData[idx_joint], invBindMatrixData[idx_joint]);
        }

        Ref<Accessor> invBindMatrixAccessor = ExportData(*mAsset, skinName, b, static_cast<unsigned int>(inverseBindMatricesData.size()), invBindMatrixData, AttribType::MAT4, AttribType::MAT4, ComponentType_FLOAT);
        if (invBindMatrixAccessor) skinRef->inverseBindMatrices = invBindMatrixAccessor;

        // Identity Matrix   =====>  skinRef->bindShapeMatrix
        // Temporary. Hard-coded identity matrix here
        skinRef->bindShapeMatrix.isPresent = true;
        IdentityMatrix4(skinRef->bindShapeMatrix.value);

        // Find node that contains this mesh and add "skeletons" and "skin" attributes to that node.
        Ref<Node> rootNode = mAsset->nodes.Get(unsigned(0));
        Ref<Node> meshNode;
        std::string meshID = mAsset->meshes.Get(unsigned(0))->id;
        FindMeshNode(rootNode, meshNode, meshID);

        Ref<Node> rootJoint = FindSkeletonRootJoint(skinRef);
        meshNode->skeletons.push_back(rootJoint);
        meshNode->skin = skinRef;
    }
}